

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttribKernelT.hh
# Opt level: O3

void __thiscall
OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
request_face_normals
          (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *this
          )

{
  uint uVar1;
  string local_40;
  
  uVar1 = this->refcount_fnormals_;
  this->refcount_fnormals_ = uVar1 + 1;
  if (uVar1 == 0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"f:normals","");
    BaseKernel::add_property<OpenMesh::VectorT<double,3>>
              ((BaseKernel *)this,&this->face_normals_,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void request_face_normals()
  {
    if (!refcount_fnormals_++)
      this->add_property( face_normals_, "f:normals" );
  }